

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3Fts5BufferSize(int *pRc,Fts5Buffer *pBuf,u32 nByte)

{
  u8 *puVar1;
  int local_3c;
  u8 *pNew;
  u64 nNew;
  u32 nByte_local;
  Fts5Buffer *pBuf_local;
  int *pRc_local;
  
  if ((uint)pBuf->nSpace < nByte) {
    if (pBuf->nSpace == 0) {
      local_3c = 0x40;
    }
    else {
      local_3c = pBuf->nSpace;
    }
    for (pNew = (u8 *)(long)local_3c; pNew < (u8 *)(ulong)nByte; pNew = (u8 *)((long)pNew << 1)) {
    }
    puVar1 = (u8 *)sqlite3_realloc64(pBuf->p,(sqlite3_uint64)pNew);
    if (puVar1 == (u8 *)0x0) {
      *pRc = 7;
      return 1;
    }
    pBuf->nSpace = (int)pNew;
    pBuf->p = puVar1;
  }
  return 0;
}

Assistant:

static int sqlite3Fts5BufferSize(int *pRc, Fts5Buffer *pBuf, u32 nByte){
  if( (u32)pBuf->nSpace<nByte ){
    u64 nNew = pBuf->nSpace ? pBuf->nSpace : 64;
    u8 *pNew;
    while( nNew<nByte ){
      nNew = nNew * 2;
    }
    pNew = sqlite3_realloc64(pBuf->p, nNew);
    if( pNew==0 ){
      *pRc = SQLITE_NOMEM;
      return 1;
    }else{
      pBuf->nSpace = (int)nNew;
      pBuf->p = pNew;
    }
  }
  return 0;
}